

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

type * __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
as<(anonymous_namespace)::ns::Value>
          (type *__return_storage_ptr__,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  bool bVar1;
  int iVar2;
  type *ptVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  undefined4 extraout_var_00;
  system_error *this_01;
  error_code __ec;
  string local_58;
  error_code local_38;
  undefined7 extraout_var;
  
  bVar1 = is_object(this);
  if (bVar1) {
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    (__return_storage_ptr__->name)._M_string_length = 0;
    (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->value = 0;
    local_58._M_dataplus._M_p = (pointer)0x4;
    local_58._M_string_length = 0x95412b;
    bVar1 = contains(this,(string_view_type *)&local_58);
    if (bVar1) {
      local_58._M_dataplus._M_p = (pointer)0x4;
      local_58._M_string_length = 0x95412b;
      json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
      set_udt_member<std::__cxx11::string>
                (this,(string_view_type *)&local_58,&__return_storage_ptr__->name);
    }
    local_58._M_dataplus._M_p = &DAT_00000005;
    local_58._M_string_length = 0x7f8ce0;
    bVar1 = contains(this,(string_view_type *)&local_58);
    ptVar3 = (type *)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      local_58._M_dataplus._M_p = &DAT_00000005;
      local_58._M_string_length = 0x7f8ce0;
      this_00 = at(this,(string_view_type *)&local_58);
      iVar2 = as_integer<int>(this_00);
      ptVar3 = (type *)CONCAT44(extraout_var_00,iVar2);
      __return_storage_ptr__->value = iVar2;
    }
    return ptVar3;
  }
  this_01 = (system_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::conv_errc,void>(&local_38,conversion_failed);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58.field_2._M_allocated_capacity._0_7_ = 0x6e206120746f4e;
  local_58.field_2._M_local_buf[7] = 's';
  local_58.field_2._8_7_ = 0x65756c61563a3a;
  local_58._M_string_length = 0xf;
  local_58.field_2._M_local_buf[0xf] = '\0';
  __ec._4_4_ = 0;
  __ec._M_value = local_38._M_value;
  *(undefined ***)(this_01 + 0x50) = &PTR__json_exception_00b2f248;
  __ec._M_cat = local_38._M_cat;
  std::system_error::system_error(this_01,__ec,&local_58);
  *(undefined8 *)this_01 = 0xb31b78;
  *(undefined8 *)(this_01 + 0x50) = 0xb31bb0;
  *(undefined8 *)(this_01 + 0x20) = 0;
  *(undefined8 *)(this_01 + 0x28) = 0;
  *(system_error **)(this_01 + 0x30) = this_01 + 0x40;
  *(undefined8 *)(this_01 + 0x38) = 0;
  this_01[0x40] = (system_error)0x0;
  __cxa_throw(this_01,&conv_error::typeinfo,conv_error::~conv_error);
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }